

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O3

void __thiscall QUrl::setPort(QUrl *this,int port)

{
  QUrlPrivate *pQVar1;
  Error *pEVar2;
  long in_FS_OFFSET;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  detach(this);
  pQVar1 = this->d;
  pEVar2 = (pQVar1->error)._M_t.
           super___uniq_ptr_impl<QUrlPrivate::Error,_std::default_delete<QUrlPrivate::Error>_>._M_t.
           super__Tuple_impl<0UL,_QUrlPrivate::Error_*,_std::default_delete<QUrlPrivate::Error>_>.
           super__Head_base<0UL,_QUrlPrivate::Error_*,_false>._M_head_impl;
  (pQVar1->error)._M_t.
  super___uniq_ptr_impl<QUrlPrivate::Error,_std::default_delete<QUrlPrivate::Error>_>._M_t.
  super__Tuple_impl<0UL,_QUrlPrivate::Error_*,_std::default_delete<QUrlPrivate::Error>_>.
  super__Head_base<0UL,_QUrlPrivate::Error_*,_false>._M_head_impl = (Error *)0x0;
  if (pEVar2 != (Error *)0x0) {
    std::default_delete<QUrlPrivate::Error>::operator()
              ((default_delete<QUrlPrivate::Error> *)&pQVar1->error,pEVar2);
  }
  pQVar1 = this->d;
  if (port - 0x10000U < 0xfffeffff) {
    QString::number(&local_38,port,10);
    if ((pQVar1->error)._M_t.
        super___uniq_ptr_impl<QUrlPrivate::Error,_std::default_delete<QUrlPrivate::Error>_>._M_t.
        super__Tuple_impl<0UL,_QUrlPrivate::Error_*,_std::default_delete<QUrlPrivate::Error>_>.
        super__Head_base<0UL,_QUrlPrivate::Error_*,_false>._M_head_impl == (Error *)0x0) {
      pEVar2 = (Error *)operator_new(0x28);
      (pEVar2->source).d.size = 0;
      pEVar2->position = 0;
      (pEVar2->source).d.d = (Data *)0x0;
      (pEVar2->source).d.ptr = (char16_t *)0x0;
      *(undefined8 *)&pEVar2->code = 0;
      (pQVar1->error)._M_t.
      super___uniq_ptr_impl<QUrlPrivate::Error,_std::default_delete<QUrlPrivate::Error>_>._M_t.
      super__Tuple_impl<0UL,_QUrlPrivate::Error_*,_std::default_delete<QUrlPrivate::Error>_>.
      super__Head_base<0UL,_QUrlPrivate::Error_*,_false>._M_head_impl = pEVar2;
      pEVar2->code = InvalidPortError;
      QString::operator=((QString *)pEVar2,&local_38);
      ((pQVar1->error)._M_t.
       super___uniq_ptr_impl<QUrlPrivate::Error,_std::default_delete<QUrlPrivate::Error>_>._M_t.
       super__Tuple_impl<0UL,_QUrlPrivate::Error_*,_std::default_delete<QUrlPrivate::Error>_>.
       super__Head_base<0UL,_QUrlPrivate::Error_*,_false>._M_head_impl)->position = 0;
    }
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
      }
    }
    this->d->port = -1;
  }
  else {
    pQVar1->port = port;
    if (port != -1) {
      pQVar1->sectionIsPresent = pQVar1->sectionIsPresent | 8;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUrl::setPort(int port)
{
    detach();
    d->clearError();

    if (port < -1 || port > 65535) {
        d->setError(QUrlPrivate::InvalidPortError, QString::number(port), 0);
        port = -1;
    }

    d->port = port;
    if (port != -1)
        d->sectionIsPresent |= QUrlPrivate::Host;
}